

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O2

boolean compress_first_pass(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JCOEF JVar1;
  uint uVar2;
  uint uVar3;
  jpeg_c_coef_controller *pjVar4;
  uint uVar5;
  uint uVar6;
  boolean bVar7;
  JBLOCKARRAY ppaJVar8;
  ulong uVar9;
  jpeg_component_info *pjVar10;
  jpeg_component_info *pjVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  jpeg_component_info *input_buf_00;
  jpeg_component_info *pjVar15;
  jpeg_component_info *pjVar16;
  JBLOCKROW paJVar17;
  jpeg_component_info *bytestozero;
  JBLOCKROW target;
  ulong uVar18;
  long lVar19;
  int local_78;
  
  pjVar4 = cinfo->coef;
  uVar5 = cinfo->total_iMCU_rows - 1;
  pjVar15 = cinfo->comp_info;
  input_buf_00 = (jpeg_component_info *)input_buf;
  for (lVar19 = 0; lVar19 < cinfo->num_components; lVar19 = lVar19 + 1) {
    ppaJVar8 = (*cinfo->mem->access_virt_barray)
                         ((j_common_ptr)cinfo,(jvirt_barray_ptr)(&pjVar4[7].start_pass)[lVar19],
                          *(int *)&pjVar4[1].start_pass * pjVar15->v_samp_factor,
                          pjVar15->v_samp_factor,1);
    if (*(uint *)&pjVar4[1].start_pass < uVar5) {
      input_buf_00 = (jpeg_component_info *)(ulong)(uint)pjVar15->v_samp_factor;
    }
    else {
      input_buf_00 = (jpeg_component_info *)
                     ((ulong)pjVar15->height_in_blocks % (ulong)(uint)pjVar15->v_samp_factor);
      if ((int)input_buf_00 == 0) {
        input_buf_00 = (jpeg_component_info *)(ulong)(uint)pjVar15->v_samp_factor;
      }
    }
    uVar2 = pjVar15->width_in_blocks;
    uVar9 = (ulong)uVar2;
    uVar3 = pjVar15->h_samp_factor;
    iVar13 = (int)(uVar9 % (ulong)uVar3);
    uVar18 = (ulong)(uVar3 - iVar13);
    if (iVar13 < 1) {
      uVar18 = uVar9 % (ulong)uVar3;
    }
    bytestozero = (jpeg_component_info *)(uVar18 * 0x80);
    iVar13 = (int)input_buf_00;
    pjVar11 = (jpeg_component_info *)0x0;
    if (0 < iVar13) {
      pjVar11 = input_buf_00;
    }
    for (pjVar16 = (jpeg_component_info *)0x0; local_78 = (int)uVar18, pjVar16 != pjVar11;
        pjVar16 = (jpeg_component_info *)((long)&pjVar16->component_id + 1)) {
      paJVar17 = ppaJVar8[(long)pjVar16];
      input_buf_00 = pjVar15;
      (*cinfo->fdct->forward_DCT)(cinfo,pjVar15,input_buf[lVar19],paJVar17,(int)pjVar16 * 8,0,uVar2)
      ;
      if (0 < local_78) {
        input_buf_00 = bytestozero;
        jzero_far(paJVar17 + uVar9,(size_t)bytestozero);
        JVar1 = paJVar17[uVar9 - 1][0];
        for (pjVar10 = (jpeg_component_info *)0x0; bytestozero != pjVar10;
            pjVar10 = (jpeg_component_info *)&pjVar10[1].height_in_blocks) {
          *(JCOEF *)((long)&pjVar10->component_id + (long)paJVar17[uVar9]) = JVar1;
        }
      }
    }
    if (*(uint *)&pjVar4[1].start_pass == uVar5) {
      pjVar11 = (jpeg_component_info *)((ulong)(local_78 + uVar2) << 7);
      uVar18 = 0;
      if (0 < (int)uVar3) {
        uVar18 = (ulong)uVar3;
      }
      for (lVar12 = (long)iVar13; lVar12 < pjVar15->v_samp_factor; lVar12 = lVar12 + 1) {
        paJVar17 = ppaJVar8[lVar12 + -1];
        target = ppaJVar8[lVar12];
        input_buf_00 = pjVar11;
        jzero_far(target,(size_t)pjVar11);
        for (uVar6 = 0; uVar6 < (local_78 + uVar2) / uVar3; uVar6 = uVar6 + 1) {
          JVar1 = paJVar17[(long)(int)uVar3 + -1][0];
          for (lVar14 = 0; uVar18 * 0x80 != lVar14; lVar14 = lVar14 + 0x80) {
            *(JCOEF *)((long)*target + lVar14) = JVar1;
          }
          paJVar17 = paJVar17 + (int)uVar3;
          target = target + (int)uVar3;
        }
      }
    }
    pjVar15 = pjVar15 + 1;
  }
  bVar7 = compress_output(cinfo,(JSAMPIMAGE)input_buf_00);
  return bVar7;
}

Assistant:

METHODDEF(boolean)
compress_first_pass(j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION blocks_across, MCUs_across, MCUindex;
  int bi, ci, h_samp_factor, block_row, block_rows, ndummy;
  JCOEF lastDC;
  jpeg_component_info *compptr;
  JBLOCKARRAY buffer;
  JBLOCKROW thisblockrow, lastblockrow;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[ci],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, TRUE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (coef->iMCU_row_num < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here, since may not be set! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    blocks_across = compptr->width_in_blocks;
    h_samp_factor = compptr->h_samp_factor;
    /* Count number of dummy blocks to be added at the right margin. */
    ndummy = (int)(blocks_across % h_samp_factor);
    if (ndummy > 0)
      ndummy = h_samp_factor - ndummy;
    /* Perform DCT for all non-dummy blocks in this iMCU row.  Each call
     * on forward_DCT processes a complete horizontal row of DCT blocks.
     */
    for (block_row = 0; block_row < block_rows; block_row++) {
      thisblockrow = buffer[block_row];
      (*cinfo->fdct->forward_DCT) (cinfo, compptr,
                                   input_buf[ci], thisblockrow,
                                   (JDIMENSION)(block_row * DCTSIZE),
                                   (JDIMENSION)0, blocks_across);
      if (ndummy > 0) {
        /* Create dummy blocks at the right edge of the image. */
        thisblockrow += blocks_across; /* => first dummy block */
        jzero_far((void *)thisblockrow, ndummy * sizeof(JBLOCK));
        lastDC = thisblockrow[-1][0];
        for (bi = 0; bi < ndummy; bi++) {
          thisblockrow[bi][0] = lastDC;
        }
      }
    }
    /* If at end of image, create dummy block rows as needed.
     * The tricky part here is that within each MCU, we want the DC values
     * of the dummy blocks to match the last real block's DC value.
     * This squeezes a few more bytes out of the resulting file...
     */
    if (coef->iMCU_row_num == last_iMCU_row) {
      blocks_across += ndummy;  /* include lower right corner */
      MCUs_across = blocks_across / h_samp_factor;
      for (block_row = block_rows; block_row < compptr->v_samp_factor;
           block_row++) {
        thisblockrow = buffer[block_row];
        lastblockrow = buffer[block_row - 1];
        jzero_far((void *)thisblockrow,
                  (size_t)(blocks_across * sizeof(JBLOCK)));
        for (MCUindex = 0; MCUindex < MCUs_across; MCUindex++) {
          lastDC = lastblockrow[h_samp_factor - 1][0];
          for (bi = 0; bi < h_samp_factor; bi++) {
            thisblockrow[bi][0] = lastDC;
          }
          thisblockrow += h_samp_factor; /* advance to next MCU in row */
          lastblockrow += h_samp_factor;
        }
      }
    }
  }
  /* NB: compress_output will increment iMCU_row_num if successful.
   * A suspension return will result in redoing all the work above next time.
   */

  /* Emit data to the entropy encoder, sharing code with subsequent passes */
  return compress_output(cinfo, input_buf);
}